

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

void __thiscall
brotli::Command::Command
          (Command *this,size_t insertlen,size_t copylen,size_t copylen_code,size_t distance_code)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar5 = (uint)insertlen;
  this->insert_len_ = uVar5;
  this->copy_len_ = (uint32_t)copylen;
  if (distance_code < 0x10) {
    this->dist_prefix_ = (uint16_t)distance_code;
    uVar7 = 0;
  }
  else {
    uVar8 = 0x1f;
    uVar4 = (uint)(distance_code - 0xc);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar9 = (uVar8 ^ 0xffffffe0) + 0x1f;
    bVar10 = (distance_code - 0xc >> ((ulong)uVar9 & 0x3f) & 1) != 0;
    this->dist_prefix_ = (ushort)bVar10 + (short)(uVar8 ^ 0xffffffe0) * 2 + 0x4c;
    uVar7 = uVar4 - (bVar10 + 2 << ((byte)uVar9 & 0x3f)) | uVar9 * 0x1000000;
  }
  this->dist_extra_ = uVar7;
  if (5 < insertlen) {
    if (insertlen < 0x82) {
      uVar5 = 0x1f;
      uVar8 = (uint)(insertlen - 2);
      if (uVar8 != 0) {
        for (; uVar8 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (int)(insertlen - 2 >> ((char)(uVar5 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
              (uVar5 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (insertlen < 0x842) {
      uVar8 = 0x1f;
      if (uVar5 - 0x42 != 0) {
        for (; uVar5 - 0x42 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar5 = (uVar8 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar5 = 0x15;
      if (0x1841 < insertlen) {
        uVar5 = (uint)(ushort)(0x17 - (insertlen < 0x5842));
      }
    }
  }
  if (copylen_code < 10) {
    uVar8 = (int)copylen_code - 2;
  }
  else if (copylen_code < 0x86) {
    uVar8 = 0x1f;
    uVar4 = (uint)(copylen_code - 6);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (int)(copylen_code - 6 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
            (uVar8 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar8 = 0x17;
    if (copylen_code < 0x846) {
      uVar4 = (int)copylen_code - 0x46;
      uVar8 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (uVar8 ^ 0xffe0) + 0x2c;
    }
  }
  uVar9 = (uVar5 & 0xffff) * 4;
  uVar4 = (uVar8 & 0xffff) * 4;
  uVar3 = (ushort)uVar8;
  iVar1 = *(int *)(kInsExtra + uVar9);
  iVar2 = *(int *)(kCopyExtra + uVar4);
  uVar9 = *(uint *)(kInsBase + uVar9);
  uVar4 = *(uint *)(kCopyBase + uVar4);
  uVar6 = (uVar3 & 7) + ((ushort)uVar5 & 7) * 8;
  if (((this->dist_prefix_ == 0) && ((ushort)uVar5 < 8)) && (uVar3 < 0x10)) {
    if (7 < uVar3) {
      uVar6 = uVar6 | 0x40;
    }
  }
  else {
    uVar6 = uVar6 | *(ushort *)
                     (CombineLengthCodes(unsigned_short,unsigned_short,bool)::cells +
                     (ulong)(((uVar5 & 0xffff) >> 3) * 3 + ((uVar8 & 0xffff) >> 3)) * 2);
  }
  this->cmd_prefix_ = uVar6;
  this->cmd_extra_ =
       copylen_code - uVar4 << ((byte)iVar1 & 0x3f) |
       (ulong)(uint)(iVar2 + iVar1) << 0x30 | insertlen - uVar9;
  return;
}

Assistant:

Command(size_t insertlen, size_t copylen, size_t copylen_code,
          size_t distance_code)
      : insert_len_(static_cast<uint32_t>(insertlen))
      , copy_len_(static_cast<uint32_t>(copylen)) {
    // The distance prefix and extra bits are stored in this Command as if
    // npostfix and ndirect were 0, they are only recomputed later after the
    // clustering if needed.
    PrefixEncodeCopyDistance(distance_code, 0, 0, &dist_prefix_, &dist_extra_);
    GetLengthCode(insertlen, copylen_code, dist_prefix_ == 0,
                  &cmd_prefix_, &cmd_extra_);
  }